

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  SPxOut *pSVar2;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rhs;
  long lVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  cpp_dec_float<200U,_int,_void> *pcVar5;
  uint *puVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *x;
  byte bVar8;
  DataKey local_248;
  longlong local_240;
  Verbosity old_verbosity;
  uint uStack_234;
  uint auStack_230 [25];
  undefined3 uStack_1cb;
  int iStack_1c8;
  bool bStack_1c4;
  undefined8 local_1c0;
  cpp_dec_float<200U,_int,_void> local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar8 = 0;
  pnVar7 = &(this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thetolerance;
  pnVar4 = pnVar7;
  puVar6 = local_b0;
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar6 = (pnVar4->m_backend).data._M_elems[0];
    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((pnVar4->m_backend).data._M_elems + 1);
    puVar6 = puVar6 + 1;
  }
  local_40 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.exp;
  local_3c = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thetolerance.m_backend.neg;
  local_38._0_4_ =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.fpclass;
  local_38._4_4_ =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.prec_elem;
  local_248 = (DataKey)selectEnterX(this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)local_b0);
  if (local_248.info == 0) {
    if (this->refined != false) {
      return (SPxId)local_248;
    }
    this->refined = true;
    pSVar2 = ((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (4 < (int)pSVar2->m_verbosity)) {
      _old_verbosity = (double)CONCAT44(uStack_234,pSVar2->m_verbosity);
      local_1b8.data._M_elems[0] = 5;
      (*pSVar2->_vptr_SPxOut[2])();
      soplex::operator<<(((this->
                          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thesolver)->spxout,"WSTEEP05 trying refinement step..\n");
      pSVar2 = ((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->spxout;
      (*pSVar2->_vptr_SPxOut[2])(pSVar2,&old_verbosity);
    }
    _old_verbosity = 2.0;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x1c;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.data._M_elems[0x10] = 0;
    result.m_backend.data._M_elems[0x11] = 0;
    result.m_backend.data._M_elems[0x12] = 0;
    result.m_backend.data._M_elems[0x13] = 0;
    result.m_backend.data._M_elems[0x14] = 0;
    result.m_backend.data._M_elems[0x15] = 0;
    result.m_backend.data._M_elems[0x16] = 0;
    result.m_backend.data._M_elems[0x17] = 0;
    result.m_backend.data._M_elems[0x18] = 0;
    result.m_backend.data._M_elems[0x19] = 0;
    result.m_backend.data._M_elems._104_5_ = 0;
    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&result.m_backend,&pnVar7->m_backend,(double *)&old_verbosity);
    local_248 = (DataKey)selectEnterX(this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)&result.m_backend);
    if (local_248.info == 0) {
      return (SPxId)local_248;
    }
  }
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  x = &pSVar1->theFvec->thedelta;
  rhs = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::vector(pSVar1,(SPxId *)&local_248);
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::solve4update(&pSVar1->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,x,rhs);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)&this->workRhs,x);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::length2((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)&local_1b8,x);
  local_1c0._0_4_ = cpp_dec_float_finite;
  local_1c0._4_4_ = 0x1c;
  _old_verbosity = 0.0;
  auStack_230[0] = 0;
  auStack_230[1] = 0;
  auStack_230[2] = 0;
  auStack_230[3] = 0;
  auStack_230[4] = 0;
  auStack_230[5] = 0;
  auStack_230[6] = 0;
  auStack_230[7] = 0;
  auStack_230[8] = 0;
  auStack_230[9] = 0;
  auStack_230[10] = 0;
  auStack_230[0xb] = 0;
  auStack_230[0xc] = 0;
  auStack_230[0xd] = 0;
  auStack_230[0x16] = 0;
  auStack_230[0x17] = 0;
  stack0xfffffffffffffe30 = 0;
  uStack_1cb = 0;
  iStack_1c8 = 0;
  bStack_1c4 = false;
  auStack_230[0xe] = 0;
  auStack_230[0xf] = 0;
  auStack_230[0x10] = 0;
  auStack_230[0x11] = 0;
  auStack_230[0x12] = 0;
  auStack_230[0x13] = 0;
  auStack_230[0x14] = 0;
  auStack_230[0x15] = 0;
  local_240 = 1;
  boost::multiprecision::default_ops::
  eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
            ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,&local_1b8,&local_240);
  pcVar5 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
  pnVar7 = &this->pi_p;
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pnVar7->m_backend).data._M_elems[0] = (pcVar5->data)._M_elems[0];
    pcVar5 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar5 + (ulong)bVar8 * -8 + 4);
    pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar7 + (ulong)bVar8 * -8 + 4);
  }
  (this->pi_p).m_backend.exp = iStack_1c8;
  (this->pi_p).m_backend.neg = bStack_1c4;
  (this->pi_p).m_backend.fpclass = (fpclass_type)local_1c0;
  (this->pi_p).m_backend.prec_elem = local_1c0._4_4_;
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pSVar1->coSolveVector2 = &this->workVec;
  pSVar1->coSolveVector2rhs = &this->workRhs;
  return (SPxId)local_248;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnter()
{
   assert(this->thesolver != nullptr);
   SPxId enterId;

   enterId = selectEnterX(this->thetolerance);

   if(!enterId.isValid() && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WSTEEP05 trying refinement step..\n";)
      enterId = selectEnterX(this->thetolerance / SOPLEX_STEEP_REFINETOL);
   }

   assert(isConsistent());

   if(enterId.isValid())
   {
      SSVectorBase<R>& delta = this->thesolver->fVec().delta();

      this->thesolver->basis().solve4update(delta, this->thesolver->vector(enterId));

      workRhs.setup_and_assign(delta);
      pi_p = 1 + delta.length2();

      this->thesolver->setup4coSolve(&workVec, &workRhs);
   }

   return enterId;
}